

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Scale_x86_avx::forward_inplace
          (Scale_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs,
          Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  void *pvVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [12];
  uint uVar23;
  reference pvVar24;
  reference pvVar25;
  int iVar26;
  undefined8 *puVar27;
  undefined8 *puVar28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  __m128 _p_14;
  __m128 _s128_1;
  __m256 _p_13;
  __m256 _s256_1;
  int j_7;
  float s_3;
  float *ptr_12;
  int i_13;
  __m128 _p_12;
  __m128 _bias128;
  __m128 _s128;
  __m256 _p_11;
  __m256 _bias256;
  __m256 _s256;
  int j_6;
  float s_2;
  float *ptr_11;
  int i_12;
  int size_4;
  __m256 _p_10;
  __m256 _s_10;
  int j_5;
  float s_1;
  float *ptr_10;
  int i_11;
  __m256 _p_9;
  __m256 _bias_5;
  __m256 _s_9;
  int j_4;
  float bias_1;
  float s;
  float *ptr_9;
  int i_10;
  int size_3;
  __m128 _p_8;
  int i_9;
  __m128 _s_8;
  float *ptr_8;
  int q_3;
  __m128 _p_7;
  int i_8;
  __m128 _bias_4;
  __m128 _s_7;
  float *ptr_7;
  int q_2;
  int size_2;
  __m128 _p_6;
  int j_3;
  __m128 _s_6;
  float *ptr_6;
  int i_7;
  __m128 _p_5;
  int j_2;
  __m128 _bias_3;
  __m128 _s_5;
  float *ptr_5;
  int i_6;
  __m256 _p_4;
  int i_5;
  __m256 _s_4;
  float *ptr_4;
  int q_1;
  __m256 _p_3;
  int i_4;
  __m256 _bias_2;
  __m256 _s_3;
  float *ptr_3;
  int q;
  int size_1;
  __m256 _p_2;
  int j_1;
  __m256 _s_2;
  float *ptr_2;
  int i_3;
  __m256 _p_1;
  int j;
  __m256 _bias_1;
  __m256 _s_1;
  float *ptr_1;
  int i_2;
  int i_1;
  __m256 _bias;
  __m256 _s;
  __m256 _p;
  int i;
  int nn;
  int remain;
  int size;
  float *ptr;
  float *bias;
  float *scale;
  int elempack;
  int dims;
  int channels;
  int h;
  int w;
  Mat *scale_blob;
  Mat *bottom_top_blob;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  int local_1ab0;
  float *local_1a60;
  int local_1a54;
  undefined8 local_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  int local_19c0;
  float *local_1970;
  int local_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  int local_1918;
  float *local_1910;
  int local_1904;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  int local_189c;
  float *local_1890;
  int local_1888;
  float fStack_1874;
  int local_1864;
  undefined1 (*local_1800) [12];
  int local_17f4;
  undefined8 local_17f0;
  undefined8 uStack_17e8;
  int local_17d4;
  undefined8 *local_1760;
  int local_1758;
  float fStack_1744;
  int local_1734;
  undefined1 (*local_1720) [12];
  int local_1714;
  undefined8 local_1710;
  undefined8 uStack_1708;
  int local_16f4;
  undefined8 *local_16d0;
  int local_16c4;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  int local_1684;
  undefined8 *local_1610;
  int local_1604;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  int local_15c4;
  undefined8 *local_1510;
  int local_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  int local_14c4;
  undefined8 *local_1490;
  int local_1484;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  int local_1444;
  undefined8 *local_13f0;
  int local_13e8;
  int local_13e4;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  int local_1380;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  float fStack_1124;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  float local_1080;
  float fStack_107c;
  float fStack_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  float fStack_1064;
  float local_1020;
  float fStack_101c;
  float fStack_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  float fStack_1004;
  float local_1000;
  float fStack_ffc;
  float fStack_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  float local_fc0;
  float fStack_fbc;
  float fStack_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float fStack_fa8;
  float local_f80;
  float fStack_f7c;
  float fStack_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float fStack_f68;
  float local_f40;
  float fStack_f3c;
  float fStack_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float fStack_f28;
  float local_f00;
  float fStack_efc;
  float fStack_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  float fStack_ee8;
  float local_ec0;
  float fStack_ebc;
  float fStack_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float fStack_ea8;
  float local_ea0;
  float fStack_e9c;
  float fStack_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float fStack_e88;
  undefined4 uStack_e84;
  float local_e80;
  float fStack_e7c;
  float fStack_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float fStack_e68;
  float local_e60;
  float fStack_e5c;
  float fStack_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float fStack_e48;
  undefined4 uStack_e44;
  float local_e40;
  float fStack_e3c;
  float fStack_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  float fStack_e28;
  float local_e20;
  float fStack_e1c;
  float fStack_e18;
  float fStack_e14;
  float fStack_e10;
  float fStack_e0c;
  float fStack_e08;
  undefined4 uStack_e04;
  float local_e00;
  float fStack_dfc;
  float fStack_df8;
  float fStack_df4;
  float fStack_df0;
  float fStack_dec;
  float fStack_de8;
  float local_de0;
  float fStack_ddc;
  float fStack_dd8;
  float fStack_dd4;
  float fStack_dd0;
  float fStack_dcc;
  float fStack_dc8;
  undefined4 uStack_dc4;
  float local_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  float local_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float local_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float local_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float local_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float local_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float local_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  
  pvVar24 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  pvVar25 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar26 = pvVar24->w;
  iVar3 = pvVar24->h;
  iVar4 = pvVar24->c;
  iVar5 = pvVar24->dims;
  iVar6 = pvVar24->elempack;
  pvVar7 = pvVar25->data;
  lVar8 = *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120);
  if (iVar5 == 1) {
    pvVar9 = pvVar24->data;
    uVar23 = iVar26 * iVar6;
    for (local_1380 = 0; local_1380 < (int)uVar23 >> 3; local_1380 = local_1380 + 1) {
      puVar27 = (undefined8 *)((long)pvVar9 + (long)(local_1380 << 3) * 4);
      puVar28 = (undefined8 *)((long)pvVar7 + (long)(local_1380 << 3) * 4);
      local_1020 = (float)*puVar27;
      fStack_101c = (float)((ulong)*puVar27 >> 0x20);
      fStack_1018 = (float)puVar27[1];
      fStack_1014 = (float)((ulong)puVar27[1] >> 0x20);
      fStack_1010 = (float)puVar27[2];
      fStack_100c = (float)((ulong)puVar27[2] >> 0x20);
      fStack_1008 = (float)puVar27[3];
      fStack_1004 = (float)((ulong)puVar27[3] >> 0x20);
      local_1000 = (float)*puVar28;
      fStack_ffc = (float)((ulong)*puVar28 >> 0x20);
      fStack_ff8 = (float)puVar28[1];
      fStack_ff4 = (float)((ulong)puVar28[1] >> 0x20);
      fStack_ff0 = (float)puVar28[2];
      fStack_fec = (float)((ulong)puVar28[2] >> 0x20);
      fStack_fe8 = (float)puVar28[3];
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        local_13a0 = CONCAT44(fStack_101c * fStack_ffc,local_1020 * local_1000);
        uStack_1398 = CONCAT44(fStack_1014 * fStack_ff4,fStack_1018 * fStack_ff8);
        uStack_1390 = CONCAT44(fStack_100c * fStack_fec,fStack_1010 * fStack_ff0);
        uStack_1388 = CONCAT44(fStack_1004,fStack_1008 * fStack_fe8);
      }
      else {
        puVar27 = (undefined8 *)(lVar8 + (long)(local_1380 << 3) * 4);
        local_660 = (float)*puVar27;
        fStack_65c = (float)((ulong)*puVar27 >> 0x20);
        fStack_658 = (float)puVar27[1];
        fStack_654 = (float)((ulong)puVar27[1] >> 0x20);
        fStack_650 = (float)puVar27[2];
        fStack_64c = (float)((ulong)puVar27[2] >> 0x20);
        fStack_648 = (float)puVar27[3];
        fStack_644 = (float)((ulong)puVar27[3] >> 0x20);
        local_13a0 = CONCAT44(fStack_101c * fStack_ffc + fStack_65c,
                              local_1020 * local_1000 + local_660);
        uStack_1398 = CONCAT44(fStack_1014 * fStack_ff4 + fStack_654,
                               fStack_1018 * fStack_ff8 + fStack_658);
        uStack_1390 = CONCAT44(fStack_100c * fStack_fec + fStack_64c,
                               fStack_1010 * fStack_ff0 + fStack_650);
        uStack_1388 = CONCAT44(fStack_1004 + fStack_644,fStack_1008 * fStack_fe8 + fStack_648);
      }
      puVar27 = (undefined8 *)((long)pvVar9 + (long)(local_1380 << 3) * 4);
      *puVar27 = local_13a0;
      puVar27[1] = uStack_1398;
      puVar27[2] = uStack_1390;
      puVar27[3] = uStack_1388;
    }
    for (local_13e4 = uVar23 - (uVar23 & 7); local_13e4 < (int)uVar23; local_13e4 = local_13e4 + 1)
    {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        *(float *)((long)pvVar9 + (long)local_13e4 * 4) =
             *(float *)((long)pvVar9 + (long)local_13e4 * 4) *
             *(float *)((long)pvVar7 + (long)local_13e4 * 4);
      }
      else {
        *(float *)((long)pvVar9 + (long)local_13e4 * 4) =
             *(float *)((long)pvVar9 + (long)local_13e4 * 4) *
             *(float *)((long)pvVar7 + (long)local_13e4 * 4) +
             *(float *)(lVar8 + (long)local_13e4 * 4);
      }
    }
  }
  else if (iVar6 == 8) {
    if (iVar5 == 2) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_1484 = 0; local_1484 < iVar3; local_1484 = local_1484 + 1) {
          local_1490 = (undefined8 *)
                       ((long)pvVar24->data +
                       (long)pvVar24->w * (long)local_1484 * pvVar24->elemsize);
          puVar27 = (undefined8 *)((long)pvVar25->data + (long)(local_1484 << 3) * 4);
          uVar14 = *puVar27;
          uVar15 = puVar27[1];
          uVar16 = puVar27[2];
          uVar17 = puVar27[3];
          for (local_14c4 = 0; local_14c4 < iVar26; local_14c4 = local_14c4 + 1) {
            local_de0 = (float)*local_1490;
            fStack_ddc = (float)((ulong)*local_1490 >> 0x20);
            fStack_dd8 = (float)local_1490[1];
            fStack_dd4 = (float)((ulong)local_1490[1] >> 0x20);
            fStack_dd0 = (float)local_1490[2];
            fStack_dcc = (float)((ulong)local_1490[2] >> 0x20);
            fStack_dc8 = (float)local_1490[3];
            uStack_dc4 = (undefined4)((ulong)local_1490[3] >> 0x20);
            local_e00 = (float)uVar14;
            fStack_dfc = (float)((ulong)uVar14 >> 0x20);
            fStack_df8 = (float)uVar15;
            fStack_df4 = (float)((ulong)uVar15 >> 0x20);
            fStack_df0 = (float)uVar16;
            fStack_dec = (float)((ulong)uVar16 >> 0x20);
            fStack_de8 = (float)uVar17;
            local_1500 = CONCAT44(fStack_ddc * fStack_dfc,local_de0 * local_e00);
            uStack_14f8 = CONCAT44(fStack_dd4 * fStack_df4,fStack_dd8 * fStack_df8);
            uStack_14f0 = CONCAT44(fStack_dcc * fStack_dec,fStack_dd0 * fStack_df0);
            uStack_14e8 = CONCAT44(uStack_dc4,fStack_dc8 * fStack_de8);
            *local_1490 = local_1500;
            local_1490[1] = uStack_14f8;
            local_1490[2] = uStack_14f0;
            local_1490[3] = uStack_14e8;
            local_1490 = local_1490 + 4;
          }
        }
      }
      else {
        for (local_13e8 = 0; local_13e8 < iVar3; local_13e8 = local_13e8 + 1) {
          local_13f0 = (undefined8 *)
                       ((long)pvVar24->data +
                       (long)pvVar24->w * (long)local_13e8 * pvVar24->elemsize);
          puVar27 = (undefined8 *)((long)pvVar25->data + (long)(local_13e8 << 3) * 4);
          uVar14 = *puVar27;
          uVar15 = puVar27[1];
          uVar16 = puVar27[2];
          uVar17 = puVar27[3];
          puVar27 = (undefined8 *)
                    (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                    (long)(local_13e8 << 3) * 4);
          uVar18 = *puVar27;
          uVar19 = puVar27[1];
          uVar20 = puVar27[2];
          uVar21 = puVar27[3];
          for (local_1444 = 0; local_1444 < iVar26; local_1444 = local_1444 + 1) {
            local_1080 = (float)*local_13f0;
            fStack_107c = (float)((ulong)*local_13f0 >> 0x20);
            fStack_1078 = (float)local_13f0[1];
            fStack_1074 = (float)((ulong)local_13f0[1] >> 0x20);
            fStack_1070 = (float)local_13f0[2];
            fStack_106c = (float)((ulong)local_13f0[2] >> 0x20);
            fStack_1068 = (float)local_13f0[3];
            fStack_1064 = (float)((ulong)local_13f0[3] >> 0x20);
            local_fc0 = (float)uVar14;
            fStack_fbc = (float)((ulong)uVar14 >> 0x20);
            fStack_fb8 = (float)uVar15;
            fStack_fb4 = (float)((ulong)uVar15 >> 0x20);
            fStack_fb0 = (float)uVar16;
            fStack_fac = (float)((ulong)uVar16 >> 0x20);
            fStack_fa8 = (float)uVar17;
            local_620 = (float)uVar18;
            fStack_61c = (float)((ulong)uVar18 >> 0x20);
            fStack_618 = (float)uVar19;
            fStack_614 = (float)((ulong)uVar19 >> 0x20);
            fStack_610 = (float)uVar20;
            fStack_60c = (float)((ulong)uVar20 >> 0x20);
            fStack_608 = (float)uVar21;
            fStack_604 = (float)((ulong)uVar21 >> 0x20);
            local_1480 = CONCAT44(fStack_107c * fStack_fbc + fStack_61c,
                                  local_1080 * local_fc0 + local_620);
            uStack_1478 = CONCAT44(fStack_1074 * fStack_fb4 + fStack_614,
                                   fStack_1078 * fStack_fb8 + fStack_618);
            uStack_1470 = CONCAT44(fStack_106c * fStack_fac + fStack_60c,
                                   fStack_1070 * fStack_fb0 + fStack_610);
            uStack_1468 = CONCAT44(fStack_1064 + fStack_604,fStack_1068 * fStack_fa8 + fStack_608);
            *local_13f0 = local_1480;
            local_13f0[1] = uStack_1478;
            local_13f0[2] = uStack_1470;
            local_13f0[3] = uStack_1468;
            local_13f0 = local_13f0 + 4;
          }
        }
      }
    }
    if (iVar5 == 3) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_1604 = 0; local_1604 < iVar4; local_1604 = local_1604 + 1) {
          local_1610 = (undefined8 *)
                       ((long)pvVar24->data + pvVar24->cstep * (long)local_1604 * pvVar24->elemsize)
          ;
          puVar27 = (undefined8 *)((long)pvVar25->data + (long)(local_1604 << 3) * 4);
          uVar14 = *puVar27;
          uVar15 = puVar27[1];
          uVar16 = puVar27[2];
          uVar17 = puVar27[3];
          for (local_1684 = 0; local_1684 < iVar26 * iVar3; local_1684 = local_1684 + 1) {
            local_e20 = (float)*local_1610;
            fStack_e1c = (float)((ulong)*local_1610 >> 0x20);
            fStack_e18 = (float)local_1610[1];
            fStack_e14 = (float)((ulong)local_1610[1] >> 0x20);
            fStack_e10 = (float)local_1610[2];
            fStack_e0c = (float)((ulong)local_1610[2] >> 0x20);
            fStack_e08 = (float)local_1610[3];
            uStack_e04 = (undefined4)((ulong)local_1610[3] >> 0x20);
            local_e40 = (float)uVar14;
            fStack_e3c = (float)((ulong)uVar14 >> 0x20);
            fStack_e38 = (float)uVar15;
            fStack_e34 = (float)((ulong)uVar15 >> 0x20);
            fStack_e30 = (float)uVar16;
            fStack_e2c = (float)((ulong)uVar16 >> 0x20);
            fStack_e28 = (float)uVar17;
            local_16c0 = CONCAT44(fStack_e1c * fStack_e3c,local_e20 * local_e40);
            uStack_16b8 = CONCAT44(fStack_e14 * fStack_e34,fStack_e18 * fStack_e38);
            uStack_16b0 = CONCAT44(fStack_e0c * fStack_e2c,fStack_e10 * fStack_e30);
            uStack_16a8 = CONCAT44(uStack_e04,fStack_e08 * fStack_e28);
            *local_1610 = local_16c0;
            local_1610[1] = uStack_16b8;
            local_1610[2] = uStack_16b0;
            local_1610[3] = uStack_16a8;
            local_1610 = local_1610 + 4;
          }
        }
      }
      else {
        for (local_1508 = 0; local_1508 < iVar4; local_1508 = local_1508 + 1) {
          local_1510 = (undefined8 *)
                       ((long)pvVar24->data + pvVar24->cstep * (long)local_1508 * pvVar24->elemsize)
          ;
          puVar27 = (undefined8 *)((long)pvVar25->data + (long)(local_1508 << 3) * 4);
          uVar14 = *puVar27;
          uVar15 = puVar27[1];
          uVar16 = puVar27[2];
          uVar17 = puVar27[3];
          puVar27 = (undefined8 *)
                    (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                    (long)(local_1508 << 3) * 4);
          uVar18 = *puVar27;
          uVar19 = puVar27[1];
          uVar20 = puVar27[2];
          uVar21 = puVar27[3];
          for (local_15c4 = 0; local_15c4 < iVar26 * iVar3; local_15c4 = local_15c4 + 1) {
            local_10e0 = (float)*local_1510;
            fStack_10dc = (float)((ulong)*local_1510 >> 0x20);
            fStack_10d8 = (float)local_1510[1];
            fStack_10d4 = (float)((ulong)local_1510[1] >> 0x20);
            fStack_10d0 = (float)local_1510[2];
            fStack_10cc = (float)((ulong)local_1510[2] >> 0x20);
            fStack_10c8 = (float)local_1510[3];
            fStack_10c4 = (float)((ulong)local_1510[3] >> 0x20);
            local_f80 = (float)uVar14;
            fStack_f7c = (float)((ulong)uVar14 >> 0x20);
            fStack_f78 = (float)uVar15;
            fStack_f74 = (float)((ulong)uVar15 >> 0x20);
            fStack_f70 = (float)uVar16;
            fStack_f6c = (float)((ulong)uVar16 >> 0x20);
            fStack_f68 = (float)uVar17;
            local_5e0 = (float)uVar18;
            fStack_5dc = (float)((ulong)uVar18 >> 0x20);
            fStack_5d8 = (float)uVar19;
            fStack_5d4 = (float)((ulong)uVar19 >> 0x20);
            fStack_5d0 = (float)uVar20;
            fStack_5cc = (float)((ulong)uVar20 >> 0x20);
            fStack_5c8 = (float)uVar21;
            fStack_5c4 = (float)((ulong)uVar21 >> 0x20);
            local_1600 = CONCAT44(fStack_10dc * fStack_f7c + fStack_5dc,
                                  local_10e0 * local_f80 + local_5e0);
            uStack_15f8 = CONCAT44(fStack_10d4 * fStack_f74 + fStack_5d4,
                                   fStack_10d8 * fStack_f78 + fStack_5d8);
            uStack_15f0 = CONCAT44(fStack_10cc * fStack_f6c + fStack_5cc,
                                   fStack_10d0 * fStack_f70 + fStack_5d0);
            uStack_15e8 = CONCAT44(fStack_10c4 + fStack_5c4,fStack_10c8 * fStack_f68 + fStack_5c8);
            *local_1510 = local_1600;
            local_1510[1] = uStack_15f8;
            local_1510[2] = uStack_15f0;
            local_1510[3] = uStack_15e8;
            local_1510 = local_1510 + 4;
          }
        }
      }
    }
  }
  else {
    if (iVar6 == 4) {
      if (iVar5 == 2) {
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
          for (local_1714 = 0; local_1714 < iVar3; local_1714 = local_1714 + 1) {
            local_1720 = (undefined1 (*) [12])
                         ((long)pvVar24->data +
                         (long)pvVar24->w * (long)local_1714 * pvVar24->elemsize);
            puVar27 = (undefined8 *)((long)pvVar25->data + (long)(local_1714 << 2) * 4);
            uVar14 = *puVar27;
            uVar15 = puVar27[1];
            for (local_1734 = 0; local_1734 < iVar26; local_1734 = local_1734 + 1) {
              auVar22 = *local_1720;
              fStack_1744 = (float)((ulong)*(undefined8 *)(*local_1720 + 8) >> 0x20);
              local_8c0 = auVar22._0_4_;
              fStack_8bc = auVar22._4_4_;
              fStack_8b8 = auVar22._8_4_;
              local_8d0 = (float)uVar14;
              fStack_8cc = (float)((ulong)uVar14 >> 0x20);
              fStack_8c8 = (float)uVar15;
              fStack_8c4 = (float)((ulong)uVar15 >> 0x20);
              *(ulong *)*local_1720 = CONCAT44(fStack_8bc * fStack_8cc,local_8c0 * local_8d0);
              *(ulong *)(*local_1720 + 8) =
                   CONCAT44(fStack_1744 * fStack_8c4,fStack_8b8 * fStack_8c8);
              local_1720 = (undefined1 (*) [12])(local_1720[1] + 4);
            }
          }
        }
        else {
          for (local_16c4 = 0; local_16c4 < iVar3; local_16c4 = local_16c4 + 1) {
            local_16d0 = (undefined8 *)
                         ((long)pvVar24->data +
                         (long)pvVar24->w * (long)local_16c4 * pvVar24->elemsize);
            puVar27 = (undefined8 *)((long)pvVar25->data + (long)(local_16c4 << 2) * 4);
            uVar14 = *puVar27;
            uVar15 = puVar27[1];
            puVar27 = (undefined8 *)
                      (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                      (long)(local_16c4 << 2) * 4);
            uVar16 = *puVar27;
            uVar17 = puVar27[1];
            for (local_16f4 = 0; local_16f4 < iVar26; local_16f4 = local_16f4 + 1) {
              local_8a0 = (float)*local_16d0;
              fStack_89c = (float)((ulong)*local_16d0 >> 0x20);
              fStack_898 = (float)local_16d0[1];
              fStack_894 = (float)((ulong)local_16d0[1] >> 0x20);
              local_8b0 = (float)uVar14;
              fStack_8ac = (float)((ulong)uVar14 >> 0x20);
              fStack_8a8 = (float)uVar15;
              fStack_8a4 = (float)((ulong)uVar15 >> 0x20);
              local_950 = (float)uVar16;
              fStack_94c = (float)((ulong)uVar16 >> 0x20);
              fStack_948 = (float)uVar17;
              fStack_944 = (float)((ulong)uVar17 >> 0x20);
              local_1710 = CONCAT44(fStack_89c * fStack_8ac + fStack_94c,
                                    local_8a0 * local_8b0 + local_950);
              uStack_1708 = CONCAT44(fStack_894 * fStack_8a4 + fStack_944,
                                     fStack_898 * fStack_8a8 + fStack_948);
              *local_16d0 = local_1710;
              local_16d0[1] = uStack_1708;
              local_16d0 = local_16d0 + 2;
            }
          }
        }
      }
      if (iVar5 == 3) {
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
          for (local_17f4 = 0; local_17f4 < iVar4; local_17f4 = local_17f4 + 1) {
            local_1800 = (undefined1 (*) [12])
                         ((long)pvVar24->data +
                         pvVar24->cstep * (long)local_17f4 * pvVar24->elemsize);
            puVar27 = (undefined8 *)((long)pvVar25->data + (long)(local_17f4 << 2) * 4);
            uVar14 = *puVar27;
            uVar15 = puVar27[1];
            for (local_1864 = 0; local_1864 < iVar26 * iVar3; local_1864 = local_1864 + 1) {
              auVar22 = *local_1800;
              fStack_1874 = (float)((ulong)*(undefined8 *)(*local_1800 + 8) >> 0x20);
              local_900 = auVar22._0_4_;
              fStack_8fc = auVar22._4_4_;
              fStack_8f8 = auVar22._8_4_;
              local_910 = (float)uVar14;
              fStack_90c = (float)((ulong)uVar14 >> 0x20);
              fStack_908 = (float)uVar15;
              fStack_904 = (float)((ulong)uVar15 >> 0x20);
              *(ulong *)*local_1800 = CONCAT44(fStack_8fc * fStack_90c,local_900 * local_910);
              *(ulong *)(*local_1800 + 8) =
                   CONCAT44(fStack_1874 * fStack_904,fStack_8f8 * fStack_908);
              local_1800 = (undefined1 (*) [12])(local_1800[1] + 4);
            }
          }
        }
        else {
          for (local_1758 = 0; local_1758 < iVar4; local_1758 = local_1758 + 1) {
            local_1760 = (undefined8 *)
                         ((long)pvVar24->data +
                         pvVar24->cstep * (long)local_1758 * pvVar24->elemsize);
            puVar27 = (undefined8 *)((long)pvVar25->data + (long)(local_1758 << 2) * 4);
            uVar14 = *puVar27;
            uVar15 = puVar27[1];
            puVar27 = (undefined8 *)
                      (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                      (long)(local_1758 << 2) * 4);
            uVar16 = *puVar27;
            uVar17 = puVar27[1];
            for (local_17d4 = 0; local_17d4 < iVar26 * iVar3; local_17d4 = local_17d4 + 1) {
              local_8e0 = (float)*local_1760;
              fStack_8dc = (float)((ulong)*local_1760 >> 0x20);
              fStack_8d8 = (float)local_1760[1];
              fStack_8d4 = (float)((ulong)local_1760[1] >> 0x20);
              local_8f0 = (float)uVar14;
              fStack_8ec = (float)((ulong)uVar14 >> 0x20);
              fStack_8e8 = (float)uVar15;
              fStack_8e4 = (float)((ulong)uVar15 >> 0x20);
              local_970 = (float)uVar16;
              fStack_96c = (float)((ulong)uVar16 >> 0x20);
              fStack_968 = (float)uVar17;
              fStack_964 = (float)((ulong)uVar17 >> 0x20);
              local_17f0 = CONCAT44(fStack_8dc * fStack_8ec + fStack_96c,
                                    local_8e0 * local_8f0 + local_970);
              uStack_17e8 = CONCAT44(fStack_8d4 * fStack_8e4 + fStack_964,
                                     fStack_8d8 * fStack_8e8 + fStack_968);
              *local_1760 = local_17f0;
              local_1760[1] = uStack_17e8;
              local_1760 = local_1760 + 2;
            }
          }
        }
      }
    }
    if (iVar6 == 1) {
      if (iVar5 == 2) {
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
          for (local_1904 = 0; local_1904 < iVar3; local_1904 = local_1904 + 1) {
            local_1910 = (float *)((long)pvVar24->data +
                                  (long)pvVar24->w * (long)local_1904 * pvVar24->elemsize);
            fVar1 = *(float *)((long)pvVar25->data + (long)local_1904 * 4);
            local_1918 = 0;
            auVar10 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
            auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)fVar1),0x20);
            auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)fVar1),0x30);
            auVar11 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
            auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar1),0x20);
            auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar1),0x30);
            for (; local_1918 + 7 < iVar26; local_1918 = local_1918 + 8) {
              local_e60 = (float)*(undefined8 *)local_1910;
              fStack_e5c = (float)((ulong)*(undefined8 *)local_1910 >> 0x20);
              fStack_e58 = (float)*(undefined8 *)(local_1910 + 2);
              fStack_e54 = (float)((ulong)*(undefined8 *)(local_1910 + 2) >> 0x20);
              fStack_e50 = (float)*(undefined8 *)(local_1910 + 4);
              fStack_e4c = (float)((ulong)*(undefined8 *)(local_1910 + 4) >> 0x20);
              fStack_e48 = (float)*(undefined8 *)(local_1910 + 6);
              uStack_e44 = (undefined4)((ulong)*(undefined8 *)(local_1910 + 6) >> 0x20);
              local_e80 = auVar11._0_4_;
              fStack_e7c = auVar11._4_4_;
              fStack_e78 = auVar11._8_4_;
              fStack_e74 = auVar11._12_4_;
              fStack_e70 = auVar10._0_4_;
              fStack_e6c = auVar10._4_4_;
              fStack_e68 = auVar10._8_4_;
              local_1960 = CONCAT44(fStack_e5c * fStack_e7c,local_e60 * local_e80);
              uStack_1958 = CONCAT44(fStack_e54 * fStack_e74,fStack_e58 * fStack_e78);
              uStack_1950 = CONCAT44(fStack_e4c * fStack_e6c,fStack_e50 * fStack_e70);
              uStack_1948 = CONCAT44(uStack_e44,fStack_e48 * fStack_e68);
              *(undefined8 *)local_1910 = local_1960;
              *(undefined8 *)(local_1910 + 2) = uStack_1958;
              *(undefined8 *)(local_1910 + 4) = uStack_1950;
              *(undefined8 *)(local_1910 + 6) = uStack_1948;
              local_1910 = local_1910 + 8;
            }
            for (; local_1918 < iVar26; local_1918 = local_1918 + 1) {
              *local_1910 = fVar1 * *local_1910;
              local_1910 = local_1910 + 1;
            }
          }
        }
        else {
          for (local_1888 = 0; local_1888 < iVar3; local_1888 = local_1888 + 1) {
            local_1890 = (float *)((long)pvVar24->data +
                                  (long)pvVar24->w * (long)local_1888 * pvVar24->elemsize);
            fVar1 = *(float *)((long)pvVar25->data + (long)local_1888 * 4);
            fVar2 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                              (long)local_1888 * 4);
            local_189c = 0;
            auVar10 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
            auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)fVar1),0x20);
            auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)fVar1),0x30);
            auVar11 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
            auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar1),0x20);
            auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar1),0x30);
            auVar12 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),0x10);
            auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)fVar2),0x20);
            auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)fVar2),0x30);
            auVar13 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),0x10);
            auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)fVar2),0x20);
            auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)fVar2),0x30);
            for (; local_189c + 7 < iVar26; local_189c = local_189c + 8) {
              local_1140 = (float)*(undefined8 *)local_1890;
              fStack_113c = (float)((ulong)*(undefined8 *)local_1890 >> 0x20);
              fStack_1138 = (float)*(undefined8 *)(local_1890 + 2);
              fStack_1134 = (float)((ulong)*(undefined8 *)(local_1890 + 2) >> 0x20);
              fStack_1130 = (float)*(undefined8 *)(local_1890 + 4);
              fStack_112c = (float)((ulong)*(undefined8 *)(local_1890 + 4) >> 0x20);
              fStack_1128 = (float)*(undefined8 *)(local_1890 + 6);
              fStack_1124 = (float)((ulong)*(undefined8 *)(local_1890 + 6) >> 0x20);
              local_f40 = auVar10._0_4_;
              fStack_f3c = auVar10._4_4_;
              fStack_f38 = auVar10._8_4_;
              fStack_f34 = auVar10._12_4_;
              fStack_f30 = auVar11._0_4_;
              fStack_f2c = auVar11._4_4_;
              fStack_f28 = auVar11._8_4_;
              local_5a0 = auVar13._0_4_;
              fStack_59c = auVar13._4_4_;
              fStack_598 = auVar13._8_4_;
              fStack_594 = auVar13._12_4_;
              fStack_590 = auVar12._0_4_;
              fStack_58c = auVar12._4_4_;
              fStack_588 = auVar12._8_4_;
              fStack_584 = auVar12._12_4_;
              local_1900 = CONCAT44(fStack_113c * fStack_f3c + fStack_59c,
                                    local_1140 * local_f40 + local_5a0);
              uStack_18f8 = CONCAT44(fStack_1134 * fStack_f34 + fStack_594,
                                     fStack_1138 * fStack_f38 + fStack_598);
              uStack_18f0 = CONCAT44(fStack_112c * fStack_f2c + fStack_58c,
                                     fStack_1130 * fStack_f30 + fStack_590);
              uStack_18e8 = CONCAT44(fStack_1124 + fStack_584,fStack_1128 * fStack_f28 + fStack_588)
              ;
              *(undefined8 *)local_1890 = local_1900;
              *(undefined8 *)(local_1890 + 2) = uStack_18f8;
              *(undefined8 *)(local_1890 + 4) = uStack_18f0;
              *(undefined8 *)(local_1890 + 6) = uStack_18e8;
              local_1890 = local_1890 + 8;
            }
            for (; local_189c < iVar26; local_189c = local_189c + 1) {
              *local_1890 = *local_1890 * fVar1 + fVar2;
              local_1890 = local_1890 + 1;
            }
          }
        }
      }
      if (iVar5 == 3) {
        iVar26 = iVar26 * iVar3;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
          for (local_1a54 = 0; local_1a54 < iVar4; local_1a54 = local_1a54 + 1) {
            local_1a60 = (float *)((long)pvVar24->data +
                                  pvVar24->cstep * (long)local_1a54 * pvVar24->elemsize);
            fVar1 = *(float *)((long)pvVar25->data + (long)local_1a54 * 4);
            local_1ab0 = 0;
            auVar10 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
            auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)fVar1),0x20);
            auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)fVar1),0x30);
            auVar11 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
            auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar1),0x20);
            auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar1),0x30);
            for (; local_1ab0 + 7 < iVar26; local_1ab0 = local_1ab0 + 8) {
              local_ea0 = (float)*(undefined8 *)local_1a60;
              fStack_e9c = (float)((ulong)*(undefined8 *)local_1a60 >> 0x20);
              fStack_e98 = (float)*(undefined8 *)(local_1a60 + 2);
              fStack_e94 = (float)((ulong)*(undefined8 *)(local_1a60 + 2) >> 0x20);
              fStack_e90 = (float)*(undefined8 *)(local_1a60 + 4);
              fStack_e8c = (float)((ulong)*(undefined8 *)(local_1a60 + 4) >> 0x20);
              fStack_e88 = (float)*(undefined8 *)(local_1a60 + 6);
              uStack_e84 = (undefined4)((ulong)*(undefined8 *)(local_1a60 + 6) >> 0x20);
              local_ec0 = auVar11._0_4_;
              fStack_ebc = auVar11._4_4_;
              fStack_eb8 = auVar11._8_4_;
              fStack_eb4 = auVar11._12_4_;
              fStack_eb0 = auVar10._0_4_;
              fStack_eac = auVar10._4_4_;
              fStack_ea8 = auVar10._8_4_;
              local_1b00 = CONCAT44(fStack_e9c * fStack_ebc,local_ea0 * local_ec0);
              uStack_1af8 = CONCAT44(fStack_e94 * fStack_eb4,fStack_e98 * fStack_eb8);
              uStack_1af0 = CONCAT44(fStack_e8c * fStack_eac,fStack_e90 * fStack_eb0);
              uStack_1ae8 = CONCAT44(uStack_e84,fStack_e88 * fStack_ea8);
              *(undefined8 *)local_1a60 = local_1b00;
              *(undefined8 *)(local_1a60 + 2) = uStack_1af8;
              *(undefined8 *)(local_1a60 + 4) = uStack_1af0;
              *(undefined8 *)(local_1a60 + 6) = uStack_1ae8;
              local_1a60 = local_1a60 + 8;
            }
            for (; local_1ab0 < iVar26; local_1ab0 = local_1ab0 + 4) {
              local_920 = (float)*(undefined8 *)local_1a60;
              fStack_91c = (float)((ulong)*(undefined8 *)local_1a60 >> 0x20);
              fStack_918 = (float)*(undefined8 *)(local_1a60 + 2);
              fStack_914 = (float)((ulong)*(undefined8 *)(local_1a60 + 2) >> 0x20);
              local_1b20 = CONCAT44(fStack_91c * fVar1,local_920 * fVar1);
              uStack_1b18 = CONCAT44(fStack_914 * fVar1,fStack_918 * fVar1);
              *(undefined8 *)local_1a60 = local_1b20;
              *(undefined8 *)(local_1a60 + 2) = uStack_1b18;
              local_1a60 = local_1a60 + 4;
            }
            for (; local_1ab0 < iVar26; local_1ab0 = local_1ab0 + 1) {
              *local_1a60 = fVar1 * *local_1a60;
              local_1a60 = local_1a60 + 1;
            }
          }
        }
        else {
          for (local_1968 = 0; local_1968 < iVar4; local_1968 = local_1968 + 1) {
            local_1970 = (float *)((long)pvVar24->data +
                                  pvVar24->cstep * (long)local_1968 * pvVar24->elemsize);
            fVar1 = *(float *)((long)pvVar25->data + (long)local_1968 * 4);
            local_19c0 = 0;
            auVar10 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
            auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)fVar1),0x20);
            auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)fVar1),0x30);
            auVar11 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
            auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar1),0x20);
            auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar1),0x30);
            uVar23 = *(uint *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                              (long)local_1968 * 4);
            auVar12 = vinsertps_avx(ZEXT416(uVar23),ZEXT416(uVar23),0x10);
            auVar12 = vinsertps_avx(auVar12,ZEXT416(uVar23),0x20);
            auVar12 = vinsertps_avx(auVar12,ZEXT416(uVar23),0x30);
            auVar13 = vinsertps_avx(ZEXT416(uVar23),ZEXT416(uVar23),0x10);
            auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar23),0x20);
            auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar23),0x30);
            for (; local_19c0 + 7 < iVar26; local_19c0 = local_19c0 + 8) {
              local_11a0 = (float)*(undefined8 *)local_1970;
              fStack_119c = (float)((ulong)*(undefined8 *)local_1970 >> 0x20);
              fStack_1198 = (float)*(undefined8 *)(local_1970 + 2);
              fStack_1194 = (float)((ulong)*(undefined8 *)(local_1970 + 2) >> 0x20);
              fStack_1190 = (float)*(undefined8 *)(local_1970 + 4);
              fStack_118c = (float)((ulong)*(undefined8 *)(local_1970 + 4) >> 0x20);
              fStack_1188 = (float)*(undefined8 *)(local_1970 + 6);
              fStack_1184 = (float)((ulong)*(undefined8 *)(local_1970 + 6) >> 0x20);
              local_f00 = auVar10._0_4_;
              fStack_efc = auVar10._4_4_;
              fStack_ef8 = auVar10._8_4_;
              fStack_ef4 = auVar10._12_4_;
              fStack_ef0 = auVar11._0_4_;
              fStack_eec = auVar11._4_4_;
              fStack_ee8 = auVar11._8_4_;
              local_560 = auVar13._0_4_;
              fStack_55c = auVar13._4_4_;
              fStack_558 = auVar13._8_4_;
              fStack_554 = auVar13._12_4_;
              fStack_550 = auVar12._0_4_;
              fStack_54c = auVar12._4_4_;
              fStack_548 = auVar12._8_4_;
              fStack_544 = auVar12._12_4_;
              local_1a20 = CONCAT44(fStack_119c * fStack_efc + fStack_55c,
                                    local_11a0 * local_f00 + local_560);
              uStack_1a18 = CONCAT44(fStack_1194 * fStack_ef4 + fStack_554,
                                     fStack_1198 * fStack_ef8 + fStack_558);
              uStack_1a10 = CONCAT44(fStack_118c * fStack_eec + fStack_54c,
                                     fStack_1190 * fStack_ef0 + fStack_550);
              uStack_1a08 = CONCAT44(fStack_1184 + fStack_544,fStack_1188 * fStack_ee8 + fStack_548)
              ;
              *(undefined8 *)local_1970 = local_1a20;
              *(undefined8 *)(local_1970 + 2) = uStack_1a18;
              *(undefined8 *)(local_1970 + 4) = uStack_1a10;
              *(undefined8 *)(local_1970 + 6) = uStack_1a08;
              local_1970 = local_1970 + 8;
            }
            fVar2 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                              (long)local_1968 * 4);
            for (; local_19c0 < iVar26; local_19c0 = local_19c0 + 4) {
              local_670 = (float)*(undefined8 *)local_1970;
              fStack_66c = (float)((ulong)*(undefined8 *)local_1970 >> 0x20);
              fStack_668 = (float)*(undefined8 *)(local_1970 + 2);
              fStack_664 = (float)((ulong)*(undefined8 *)(local_1970 + 2) >> 0x20);
              local_1a50 = CONCAT44(fStack_66c * fVar1 + fVar2,local_670 * fVar1 + fVar2);
              uStack_1a48 = CONCAT44(fStack_664 * fVar1 + fVar2,fStack_668 * fVar1 + fVar2);
              *(undefined8 *)local_1970 = local_1a50;
              *(undefined8 *)(local_1970 + 2) = uStack_1a48;
              local_1970 = local_1970 + 4;
            }
            for (; local_19c0 < iVar26; local_19c0 = local_19c0 + 1) {
              *local_1970 = *local_1970 * fVar1 +
                            *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120)
                                      + (long)local_1968 * 4);
              local_1970 = local_1970 + 1;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int Scale_x86_avx::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    Mat& bottom_top_blob = bottom_top_blobs[0];
    const Mat& scale_blob = bottom_top_blobs[1];

    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int channels = bottom_top_blob.c;
    const int dims = bottom_top_blob.dims;

    const int elempack = bottom_top_blob.elempack;

    const float* scale = scale_blob;
    const float* bias = bias_data;

    if (dims == 1)
    {
        float* ptr = (float*)bottom_top_blob;
        int size = w * elempack;

        int remain = size;
#if __SSE2__
#if __AVX__
        int nn = size >> 3;
        remain = size & 7;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < nn; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr + i * 8);
            __m256 _s = _mm256_loadu_ps(scale + i * 8);
            if (bias_term)
            {
                __m256 _bias = _mm256_loadu_ps(bias + i * 8);
                _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
            }
            else
            {
                _p = _mm256_mul_ps(_p, _s);
            }
            _mm256_storeu_ps(ptr + i * 8, _p);
        }
#else
        int nn = size >> 2;
        remain = size & 3;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < nn; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr + i * 4);
            __m128 _s = _mm_loadu_ps(scale + i * 4);
            if (bias_term)
            {
                __m128 _bias = _mm_loadu_ps(bias + i * 4);
                _p = _mm_comp_fmadd_ps(_p, _s, _bias);
            }
            else
            {
                _p = _mm_mul_ps(_p, _s);
            }
            _mm_storeu_ps(ptr + i * 4, _p);
        }
#endif // __AVX__
#endif // __SSE2__
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = size - remain; i < size; i++)
        {
            if (bias_term)
            {
                ptr[i] = ptr[i] * scale[i] + bias[i];
            }
            else
            {
                ptr[i] = ptr[i] * scale[i];
            }
        }

        return 0;
    }

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 2)
        {
            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + i * 8);
                    __m256 _bias = _mm256_loadu_ps((const float*)bias_data + i * 8);

                    for (int j = 0; j < w; j++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + i * 8);

                    for (int j = 0; j < w; j++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int size = w * h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + q * 8);
                    __m256 _bias = _mm256_loadu_ps((const float*)bias_data + q * 8);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + q * 8);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
        }
        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 2)
        {
            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + i * 4);
                    __m128 _bias = _mm_loadu_ps((const float*)bias_data + i * 4);

                    for (int j = 0; j < w; j++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + i * 4);

                    for (int j = 0; j < w; j++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int size = w * h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + q * 4);
                    __m128 _bias = _mm_loadu_ps((const float*)bias_data + q * 4);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + q * 4);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1)
    {
        if (dims == 2)
        {
            int size = w;
            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);

                    float s = scale_blob[i];
                    float bias = bias_data[i];

                    int j = 0;
#if __SSE2__
#if __AVX__
                    __m256 _s = _mm256_set1_ps(s);
                    __m256 _bias = _mm256_set1_ps(bias);

                    for (; j + 7 < size; j += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
#else
                    __m128 _s = _mm_set1_ps(s);
                    __m128 _bias = _mm_set1_ps(bias);

                    for (; j + 3 < size; j += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _s, _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
#endif // __AVX__
#endif // __SSE2__

                    for (; j < size; j++)
                    {
                        *ptr = *ptr * s + bias;

                        ptr++;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);

                    float s = scale_blob[i];

                    int j = 0;
#if __SSE2__
#if __AVX__
                    __m256 _s = _mm256_set1_ps(s);

                    for (; j + 7 < size; j += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
#else
                    __m128 _s = _mm_set1_ps(s);

                    for (; j + 3 < size; j += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
#endif // __AVX__
#endif // __SSE2__

                    for (; j < size; j++)
                    {
                        *ptr *= s;

                        ptr++;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int size = w * h;
            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < channels; i++)
                {
                    float* ptr = bottom_top_blob.channel(i);

                    float s = scale_blob[i];

                    int j = 0;
#if __SSE2__
#if __AVX__
                    __m256 _s256 = _mm256_set1_ps(s);
                    __m256 _bias256 = _mm256_set1_ps(bias_data[i]);
                    for (; j + 7 < size; j += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s256, _bias256);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _s128 = _mm_set1_ps(s);
                    __m128 _bias128 = _mm_set1_ps(bias_data[i]);
                    for (; j < size; j += 4)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _s128, _bias128);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
#endif // __SSE2__

                    for (; j < size; j++)
                    {
                        *ptr = *ptr * s + bias_data[i];
                        ptr++;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < channels; i++)
                {
                    float* ptr = bottom_top_blob.channel(i);

                    float s = scale_blob[i];

                    int j = 0;
#if __SSE2__
#if __AVX__
                    __m256 _s256 = _mm256_set1_ps(s);
                    for (; j + 7 < size; j += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s256);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
#endif // __AVX__

                    __m128 _s128 = _mm_set1_ps(s);
                    for (; j < size; j += 4)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        _p = _mm_mul_ps(_p, _s128);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
#endif // __SSE2__

                    for (; j < size; j++)
                    {
                        *ptr *= s;
                        ptr++;
                    }
                }
            }
        }
    }

    return 0;
}